

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_flushProduced
                 (ZSTDMT_CCtx *mtctx,ZSTD_outBuffer *output,uint blockToFlush,ZSTD_EndDirective end)

{
  ulong uVar1;
  ulong uVar2;
  ZSTDMT_jobDescription *pZVar3;
  uint uVar4;
  uint uVar5;
  unsigned_long_long uVar6;
  size_t local_70;
  size_t toFlush;
  U32 checksum;
  size_t srcSize;
  size_t srcConsumed;
  size_t cSize;
  uint wJobID;
  ZSTD_EndDirective end_local;
  uint blockToFlush_local;
  ZSTD_outBuffer *output_local;
  ZSTDMT_CCtx *mtctx_local;
  
  uVar4 = mtctx->doneJobID & mtctx->jobIDMask;
  if (output->size < output->pos) {
    __assert_fail("output->size >= output->pos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x50ec,
                  "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                 );
  }
  pthread_mutex_lock((pthread_mutex_t *)&mtctx->jobs[uVar4].job_mutex);
  if ((blockToFlush != 0) && (mtctx->doneJobID < mtctx->nextJobID)) {
    if (mtctx->jobs[uVar4].cSize < mtctx->jobs[uVar4].dstFlushed) {
      __assert_fail("mtctx->jobs[wJobID].dstFlushed <= mtctx->jobs[wJobID].cSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x50f1,
                    "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                   );
    }
    while ((mtctx->jobs[uVar4].dstFlushed == mtctx->jobs[uVar4].cSize &&
           (mtctx->jobs[uVar4].consumed != mtctx->jobs[uVar4].src.size))) {
      pthread_cond_wait((pthread_cond_t *)&mtctx->jobs[uVar4].job_cond,
                        (pthread_mutex_t *)&mtctx->jobs[uVar4].job_mutex);
    }
  }
  srcConsumed = mtctx->jobs[uVar4].cSize;
  uVar1 = mtctx->jobs[uVar4].consumed;
  uVar2 = mtctx->jobs[uVar4].src.size;
  pthread_mutex_unlock((pthread_mutex_t *)&mtctx->jobs[uVar4].job_mutex);
  uVar5 = ZSTD_isError(srcConsumed);
  if (uVar5 == 0) {
    if (uVar2 < uVar1) {
      __assert_fail("srcConsumed <= srcSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x510a,
                    "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                   );
    }
    if ((uVar1 == uVar2) && (mtctx->jobs[uVar4].frameChecksumNeeded != 0)) {
      uVar6 = ZSTD_XXH64_digest(&(mtctx->serial).xxhState);
      MEM_writeLE32((void *)((long)mtctx->jobs[uVar4].dstBuff.start + mtctx->jobs[uVar4].cSize),
                    (U32)uVar6);
      srcConsumed = (long)&((ZSTDMT_CCtx *)srcConsumed)->factory + 4;
      mtctx->jobs[uVar4].cSize = mtctx->jobs[uVar4].cSize + 4;
      mtctx->jobs[uVar4].frameChecksumNeeded = 0;
    }
    if (srcConsumed != 0) {
      if (srcConsumed - mtctx->jobs[uVar4].dstFlushed < output->size - output->pos) {
        local_70 = srcConsumed - mtctx->jobs[uVar4].dstFlushed;
      }
      else {
        local_70 = output->size - output->pos;
      }
      if (mtctx->nextJobID <= mtctx->doneJobID) {
        __assert_fail("mtctx->doneJobID < mtctx->nextJobID",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x5119,
                      "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                     );
      }
      if (srcConsumed < mtctx->jobs[uVar4].dstFlushed) {
        __assert_fail("cSize >= mtctx->jobs[wJobID].dstFlushed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x511a,
                      "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                     );
      }
      if (mtctx->jobs[uVar4].dstBuff.start == (void *)0x0) {
        __assert_fail("mtctx->jobs[wJobID].dstBuff.start != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x511b,
                      "size_t ZSTDMT_flushProduced(ZSTDMT_CCtx *, ZSTD_outBuffer *, unsigned int, ZSTD_EndDirective)"
                     );
      }
      if (local_70 != 0) {
        memcpy((void *)((long)output->dst + output->pos),
               (void *)((long)mtctx->jobs[uVar4].dstBuff.start + mtctx->jobs[uVar4].dstFlushed),
               local_70);
      }
      output->pos = local_70 + output->pos;
      mtctx->jobs[uVar4].dstFlushed = local_70 + mtctx->jobs[uVar4].dstFlushed;
      if ((uVar1 == uVar2) && (mtctx->jobs[uVar4].dstFlushed == srcConsumed)) {
        ZSTDMT_releaseBuffer(mtctx->bufPool,mtctx->jobs[uVar4].dstBuff);
        pZVar3 = mtctx->jobs;
        pZVar3[uVar4].dstBuff.start = (void *)0x0;
        pZVar3[uVar4].dstBuff.capacity = 0;
        mtctx->jobs[uVar4].cSize = 0;
        mtctx->consumed = uVar2 + mtctx->consumed;
        mtctx->produced = srcConsumed + mtctx->produced;
        mtctx->doneJobID = mtctx->doneJobID + 1;
      }
    }
    if (mtctx->jobs[uVar4].dstFlushed < srcConsumed) {
      mtctx_local = (ZSTDMT_CCtx *)(srcConsumed - mtctx->jobs[uVar4].dstFlushed);
    }
    else if (uVar1 < uVar2) {
      mtctx_local = (ZSTDMT_CCtx *)0x1;
    }
    else if (mtctx->doneJobID < mtctx->nextJobID) {
      mtctx_local = (ZSTDMT_CCtx *)0x1;
    }
    else if (mtctx->jobReady == 0) {
      if ((mtctx->inBuff).filled == 0) {
        mtctx->allJobsCompleted = mtctx->frameEnded;
        if (end == ZSTD_e_end) {
          mtctx_local = (ZSTDMT_CCtx *)(ulong)((mtctx->frameEnded != 0 ^ 0xffU) & 1);
        }
        else {
          mtctx_local = (ZSTDMT_CCtx *)0x0;
        }
      }
      else {
        mtctx_local = (ZSTDMT_CCtx *)0x1;
      }
    }
    else {
      mtctx_local = (ZSTDMT_CCtx *)0x1;
    }
  }
  else {
    ZSTDMT_waitForAllJobsCompleted(mtctx);
    ZSTDMT_releaseAllJobResources(mtctx);
    mtctx_local = (ZSTDMT_CCtx *)srcConsumed;
  }
  return (size_t)mtctx_local;
}

Assistant:

static size_t ZSTDMT_flushProduced(ZSTDMT_CCtx* mtctx, ZSTD_outBuffer* output, unsigned blockToFlush, ZSTD_EndDirective end)
{
    unsigned const wJobID = mtctx->doneJobID & mtctx->jobIDMask;
    DEBUGLOG(5, "ZSTDMT_flushProduced (blocking:%u , job %u <= %u)",
                blockToFlush, mtctx->doneJobID, mtctx->nextJobID);
    assert(output->size >= output->pos);

    ZSTD_PTHREAD_MUTEX_LOCK(&mtctx->jobs[wJobID].job_mutex);
    if (  blockToFlush
      && (mtctx->doneJobID < mtctx->nextJobID) ) {
        assert(mtctx->jobs[wJobID].dstFlushed <= mtctx->jobs[wJobID].cSize);
        while (mtctx->jobs[wJobID].dstFlushed == mtctx->jobs[wJobID].cSize) {  /* nothing to flush */
            if (mtctx->jobs[wJobID].consumed == mtctx->jobs[wJobID].src.size) {
                DEBUGLOG(5, "job %u is completely consumed (%u == %u) => don't wait for cond, there will be none",
                            mtctx->doneJobID, (U32)mtctx->jobs[wJobID].consumed, (U32)mtctx->jobs[wJobID].src.size);
                break;
            }
            DEBUGLOG(5, "waiting for something to flush from job %u (currently flushed: %u bytes)",
                        mtctx->doneJobID, (U32)mtctx->jobs[wJobID].dstFlushed);
            ZSTD_pthread_cond_wait(&mtctx->jobs[wJobID].job_cond, &mtctx->jobs[wJobID].job_mutex);  /* block when nothing to flush but some to come */
    }   }

    /* try to flush something */
    {   size_t cSize = mtctx->jobs[wJobID].cSize;                  /* shared */
        size_t const srcConsumed = mtctx->jobs[wJobID].consumed;   /* shared */
        size_t const srcSize = mtctx->jobs[wJobID].src.size;       /* read-only, could be done after mutex lock, but no-declaration-after-statement */
        ZSTD_pthread_mutex_unlock(&mtctx->jobs[wJobID].job_mutex);
        if (ZSTD_isError(cSize)) {
            DEBUGLOG(5, "ZSTDMT_flushProduced: job %u : compression error detected : %s",
                        mtctx->doneJobID, ZSTD_getErrorName(cSize));
            ZSTDMT_waitForAllJobsCompleted(mtctx);
            ZSTDMT_releaseAllJobResources(mtctx);
            return cSize;
        }
        /* add frame checksum if necessary (can only happen once) */
        assert(srcConsumed <= srcSize);
        if ( (srcConsumed == srcSize)   /* job completed -> worker no longer active */
          && mtctx->jobs[wJobID].frameChecksumNeeded ) {
            U32 const checksum = (U32)XXH64_digest(&mtctx->serial.xxhState);
            DEBUGLOG(4, "ZSTDMT_flushProduced: writing checksum : %08X \n", checksum);
            MEM_writeLE32((char*)mtctx->jobs[wJobID].dstBuff.start + mtctx->jobs[wJobID].cSize, checksum);
            cSize += 4;
            mtctx->jobs[wJobID].cSize += 4;  /* can write this shared value, as worker is no longer active */
            mtctx->jobs[wJobID].frameChecksumNeeded = 0;
        }

        if (cSize > 0) {   /* compression is ongoing or completed */
            size_t const toFlush = MIN(cSize - mtctx->jobs[wJobID].dstFlushed, output->size - output->pos);
            DEBUGLOG(5, "ZSTDMT_flushProduced: Flushing %u bytes from job %u (completion:%u/%u, generated:%u)",
                        (U32)toFlush, mtctx->doneJobID, (U32)srcConsumed, (U32)srcSize, (U32)cSize);
            assert(mtctx->doneJobID < mtctx->nextJobID);
            assert(cSize >= mtctx->jobs[wJobID].dstFlushed);
            assert(mtctx->jobs[wJobID].dstBuff.start != NULL);
            if (toFlush > 0) {
                memcpy((char*)output->dst + output->pos,
                    (const char*)mtctx->jobs[wJobID].dstBuff.start + mtctx->jobs[wJobID].dstFlushed,
                    toFlush);
            }
            output->pos += toFlush;
            mtctx->jobs[wJobID].dstFlushed += toFlush;  /* can write : this value is only used by mtctx */

            if ( (srcConsumed == srcSize)    /* job is completed */
              && (mtctx->jobs[wJobID].dstFlushed == cSize) ) {   /* output buffer fully flushed => free this job position */
                DEBUGLOG(5, "Job %u completed (%u bytes), moving to next one",
                        mtctx->doneJobID, (U32)mtctx->jobs[wJobID].dstFlushed);
                ZSTDMT_releaseBuffer(mtctx->bufPool, mtctx->jobs[wJobID].dstBuff);
                DEBUGLOG(5, "dstBuffer released");
                mtctx->jobs[wJobID].dstBuff = g_nullBuffer;
                mtctx->jobs[wJobID].cSize = 0;   /* ensure this job slot is considered "not started" in future check */
                mtctx->consumed += srcSize;
                mtctx->produced += cSize;
                mtctx->doneJobID++;
        }   }

        /* return value : how many bytes left in buffer ; fake it to 1 when unknown but >0 */
        if (cSize > mtctx->jobs[wJobID].dstFlushed) return (cSize - mtctx->jobs[wJobID].dstFlushed);
        if (srcSize > srcConsumed) return 1;   /* current job not completely compressed */
    }
    if (mtctx->doneJobID < mtctx->nextJobID) return 1;   /* some more jobs ongoing */
    if (mtctx->jobReady) return 1;      /* one job is ready to push, just not yet in the list */
    if (mtctx->inBuff.filled > 0) return 1;   /* input is not empty, and still needs to be converted into a job */
    mtctx->allJobsCompleted = mtctx->frameEnded;   /* all jobs are entirely flushed => if this one is last one, frame is completed */
    if (end == ZSTD_e_end) return !mtctx->frameEnded;  /* for ZSTD_e_end, question becomes : is frame completed ? instead of : are internal buffers fully flushed ? */
    return 0;   /* internal buffers fully flushed */
}